

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbirb.cpp
# Opt level: O0

RBBIDataHeader * __thiscall icu_63::RBBIRuleBuilder::flattenData(RBBIRuleBuilder *this)

{
  int iVar1;
  UBool UVar2;
  int32_t iVar3;
  Char16Ptr local_98;
  long local_90;
  int32_t *ruleStatusTable;
  RBBIDataHeader *data;
  int32_t local_78;
  int32_t totalSize;
  int32_t rulesSize;
  int32_t statusTableSize;
  int32_t trieSize;
  int32_t reverseTableSize;
  int32_t forwardTableSize;
  int32_t headerSize;
  int local_1c;
  RBBIRuleBuilder *pRStack_18;
  int32_t i;
  RBBIRuleBuilder *this_local;
  
  pRStack_18 = this;
  UVar2 = ::U_FAILURE(*this->fStatus);
  if (UVar2 == '\0') {
    RBBIRuleScanner::stripRules((UnicodeString *)&forwardTableSize,&this->fStrippedRules);
    UnicodeString::operator=(&this->fStrippedRules,(UnicodeString *)&forwardTableSize);
    UnicodeString::~UnicodeString((UnicodeString *)&forwardTableSize);
    reverseTableSize = align8(0x50);
    iVar3 = RBBITableBuilder::getTableSize(this->fForwardTable);
    trieSize = align8(iVar3);
    iVar3 = RBBITableBuilder::getSafeTableSize(this->fForwardTable);
    statusTableSize = align8(iVar3);
    iVar3 = RBBISetBuilder::getTrieSize(this->fSetBuilder);
    rulesSize = align8(iVar3);
    iVar3 = UVector::size(this->fRuleStatusVals);
    totalSize = align8(iVar3 << 2);
    iVar3 = UnicodeString::length(&this->fStrippedRules);
    local_78 = align8((iVar3 + 1) * 2);
    data._4_4_ = reverseTableSize + trieSize + statusTableSize + totalSize + rulesSize + local_78;
    ruleStatusTable = (int32_t *)uprv_malloc_63((long)data._4_4_);
    if (ruleStatusTable == (int32_t *)0x0) {
      *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
      this_local = (RBBIRuleBuilder *)0x0;
    }
    else {
      memset(ruleStatusTable,0,(long)data._4_4_);
      *ruleStatusTable = 0xb1a0;
      *(undefined1 *)(ruleStatusTable + 1) = 5;
      *(undefined1 *)((long)ruleStatusTable + 5) = 0;
      *(undefined1 *)((long)ruleStatusTable + 6) = 0;
      *(undefined1 *)((long)ruleStatusTable + 7) = 0;
      ruleStatusTable[2] = data._4_4_;
      iVar3 = RBBISetBuilder::getNumCharCategories(this->fSetBuilder);
      ruleStatusTable[3] = iVar3;
      ruleStatusTable[4] = reverseTableSize;
      ruleStatusTable[5] = trieSize;
      ruleStatusTable[6] = ruleStatusTable[4] + ruleStatusTable[5];
      ruleStatusTable[7] = statusTableSize;
      ruleStatusTable[8] = ruleStatusTable[6] + ruleStatusTable[7];
      iVar3 = RBBISetBuilder::getTrieSize(this->fSetBuilder);
      ruleStatusTable[9] = iVar3;
      ruleStatusTable[0xc] = ruleStatusTable[8] + rulesSize;
      ruleStatusTable[0xd] = totalSize;
      ruleStatusTable[10] = ruleStatusTable[0xc] + totalSize;
      iVar3 = UnicodeString::length(&this->fStrippedRules);
      ruleStatusTable[0xb] = iVar3 << 1;
      memset(ruleStatusTable + 0xe,0,0x18);
      RBBITableBuilder::exportTable
                (this->fForwardTable,
                 (void *)((long)ruleStatusTable + (ulong)(uint)ruleStatusTable[4]));
      RBBITableBuilder::exportSafeTable
                (this->fForwardTable,
                 (void *)((long)ruleStatusTable + (ulong)(uint)ruleStatusTable[6]));
      RBBISetBuilder::serializeTrie
                (this->fSetBuilder,
                 (uint8_t *)((long)ruleStatusTable + (ulong)(uint)ruleStatusTable[8]));
      local_90 = (long)ruleStatusTable + (ulong)(uint)ruleStatusTable[0xc];
      local_1c = 0;
      while( true ) {
        iVar1 = local_1c;
        iVar3 = UVector::size(this->fRuleStatusVals);
        if (iVar3 <= iVar1) break;
        iVar3 = UVector::elementAti(this->fRuleStatusVals,local_1c);
        *(int32_t *)(local_90 + (long)local_1c * 4) = iVar3;
        local_1c = local_1c + 1;
      }
      Char16Ptr::Char16Ptr
                (&local_98,(char16_t *)((long)ruleStatusTable + (ulong)(uint)ruleStatusTable[10]));
      UnicodeString::extract(&this->fStrippedRules,&local_98,local_78 / 2 + 1,this->fStatus);
      Char16Ptr::~Char16Ptr(&local_98);
      this_local = (RBBIRuleBuilder *)ruleStatusTable;
    }
  }
  else {
    this_local = (RBBIRuleBuilder *)0x0;
  }
  return (RBBIDataHeader *)this_local;
}

Assistant:

RBBIDataHeader *RBBIRuleBuilder::flattenData() {
    int32_t    i;

    if (U_FAILURE(*fStatus)) {
        return NULL;
    }

    // Remove whitespace from the rules to make it smaller.
    // The rule parser has already removed comments.
    fStrippedRules = fScanner->stripRules(fStrippedRules);

    // Calculate the size of each section in the data.
    //   Sizes here are padded up to a multiple of 8 for better memory alignment.
    //   Sections sizes actually stored in the header are for the actual data
    //     without the padding.
    //
    int32_t headerSize        = align8(sizeof(RBBIDataHeader));
    int32_t forwardTableSize  = align8(fForwardTable->getTableSize());
    int32_t reverseTableSize  = align8(fForwardTable->getSafeTableSize());
    int32_t trieSize          = align8(fSetBuilder->getTrieSize());
    int32_t statusTableSize   = align8(fRuleStatusVals->size() * sizeof(int32_t));
    int32_t rulesSize         = align8((fStrippedRules.length()+1) * sizeof(UChar));

    int32_t         totalSize = headerSize
                                + forwardTableSize
                                + reverseTableSize
                                + statusTableSize + trieSize + rulesSize;

    RBBIDataHeader  *data     = (RBBIDataHeader *)uprv_malloc(totalSize);
    if (data == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    uprv_memset(data, 0, totalSize);


    data->fMagic            = 0xb1a0;
    data->fFormatVersion[0] = RBBI_DATA_FORMAT_VERSION[0];
    data->fFormatVersion[1] = RBBI_DATA_FORMAT_VERSION[1];
    data->fFormatVersion[2] = RBBI_DATA_FORMAT_VERSION[2];
    data->fFormatVersion[3] = RBBI_DATA_FORMAT_VERSION[3];
    data->fLength           = totalSize;
    data->fCatCount         = fSetBuilder->getNumCharCategories();

    data->fFTable        = headerSize;
    data->fFTableLen     = forwardTableSize;

    data->fRTable        = data->fFTable  + data->fFTableLen;
    data->fRTableLen     = reverseTableSize;

    data->fTrie          = data->fRTable + data->fRTableLen;
    data->fTrieLen       = fSetBuilder->getTrieSize();
    data->fStatusTable   = data->fTrie    + trieSize;
    data->fStatusTableLen= statusTableSize;
    data->fRuleSource    = data->fStatusTable + statusTableSize;
    data->fRuleSourceLen = fStrippedRules.length() * sizeof(UChar);

    uprv_memset(data->fReserved, 0, sizeof(data->fReserved));

    fForwardTable->exportTable((uint8_t *)data + data->fFTable);
    fForwardTable->exportSafeTable((uint8_t *)data + data->fRTable);
    fSetBuilder->serializeTrie ((uint8_t *)data + data->fTrie);

    int32_t *ruleStatusTable = (int32_t *)((uint8_t *)data + data->fStatusTable);
    for (i=0; i<fRuleStatusVals->size(); i++) {
        ruleStatusTable[i] = fRuleStatusVals->elementAti(i);
    }

    fStrippedRules.extract((UChar *)((uint8_t *)data+data->fRuleSource), rulesSize/2+1, *fStatus);

    return data;
}